

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O2

void Sdm_ManPrintDsdStats(Sdm_Man_t *p,int fVerbose)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar3 = 0;
  uVar2 = 0;
  for (lVar4 = 0x1108; lVar4 != 0x1a54; lVar4 = lVar4 + 4) {
    if (*(int *)((long)(p->Perm6 + -7) + 2 + lVar4) == 0) {
      uVar2 = uVar2 + 1;
    }
    else if (fVerbose != 0) {
      printf("%5d  :  ",uVar3);
      printf("%-20s   ",*(undefined8 *)((long)p->pDsd6 + lVar4 * 8 + -0x8828));
      printf("%8d ",(ulong)*(uint *)((long)(p->Perm6 + -7) + 2 + lVar4));
      putchar(10);
    }
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  printf("Unused classes = %d (%.2f %%).  ",((double)(int)uVar2 * 100.0) / 595.0,(ulong)uVar2);
  iVar1 = 1;
  if (1 < p->nAllDsd) {
    iVar1 = p->nAllDsd;
  }
  printf("Non-DSD cuts = %d (%.2f %%).  ",((double)p->nNonDsd * 100.0) / (double)iVar1);
  putchar(10);
  return;
}

Assistant:

void Sdm_ManPrintDsdStats( Sdm_Man_t * p, int fVerbose )
{
    int i, Absent = 0;
    for ( i = 0; i < DSD_CLASS_NUM; i++ )
    {
        if ( p->nCountDsd[i] == 0 )
        {
            Absent++;
            continue;
        }
        if ( fVerbose )
        {
            printf( "%5d  :  ", i );
            printf( "%-20s   ", p->pDsd6[i].pStr );
            printf( "%8d ",     p->nCountDsd[i] );
            printf( "\n" );
        }
    }
    printf( "Unused classes = %d (%.2f %%).  ", Absent, 100.0 * Absent / DSD_CLASS_NUM );
    printf( "Non-DSD cuts = %d (%.2f %%).  ",   p->nNonDsd, 100.0 * p->nNonDsd / Abc_MaxInt(1, p->nAllDsd) );
    printf( "\n" );
}